

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSymbol.cpp
# Opt level: O2

Var Js::JavascriptSymbol::EntryDescription(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Var pvVar5;
  JavascriptSymbol *pJVar6;
  JavascriptSymbolObject *pJVar7;
  PropertyString *pPVar8;
  int in_stack_00000010;
  undefined1 local_30 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSymbol.cpp"
                                ,0xd2,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bca9d0;
    *puVar4 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_30,(CallInfo *)&args.super_Arguments.Values,
             (Var *)&stack0x00000018);
  if ((local_30._0_4_ & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSymbol.cpp"
                                ,0xd3,"(args.Info.Count)","Should always have implicit \'this\'.");
    if (!bVar3) goto LAB_00bca9d0;
    *puVar4 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSymbol.cpp"
                                ,0xd6,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00bca9d0:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pvVar5 = Arguments::operator[]((Arguments *)local_30,0);
  bVar3 = VarIs<Js::JavascriptSymbol>(pvVar5);
  if (bVar3) {
    pJVar6 = VarTo<Js::JavascriptSymbol>(pvVar5);
  }
  else {
    bVar3 = VarIs<Js::JavascriptSymbolObject>(pvVar5);
    if (!bVar3) {
      pvVar5 = TryInvokeRemotelyOrThrow
                         (EntryDescription,pSVar1,(Arguments *)local_30,-0x7ff5ea1a,
                          L"Symbol.prototype.description");
      return pvVar5;
    }
    pJVar7 = VarTo<Js::JavascriptSymbolObject>(pvVar5);
    pJVar6 = (pJVar7->value).ptr;
  }
  pPVar8 = ScriptContext::GetPropertyString
                     (pSVar1,((pJVar6->propertyRecordUsageCache).propertyRecord.ptr)->pid);
  return pPVar8;
}

Assistant:

Var JavascriptSymbol::EntryDescription(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        AssertMsg(args.Info.Count, "Should always have implicit 'this'.");
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        const PropertyRecord* val;
        Var aValue = args[0];
        if (VarIs<JavascriptSymbol>(aValue))
        {
            val = VarTo<JavascriptSymbol>(aValue)->GetValue();
        }
        else if (VarIs<JavascriptSymbolObject>(aValue))
        {
            val = VarTo<JavascriptSymbolObject>(aValue)->GetValue();
        }
        else
        {
            return TryInvokeRemotelyOrThrow(EntryDescription, scriptContext, args, JSERR_This_NeedSymbol, _u("Symbol.prototype.description"));
        }

        return scriptContext->GetPropertyString(val->GetPropertyId());
    }